

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::HasProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl,
          PropertyValueInfo *info)

{
  ScriptContext *this_00;
  bool bVar1;
  PropertyIndex index;
  BOOL BVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  uint32 local_34 [2];
  uint32 indexVal;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  index = TypePath::LookupInline
                    ((this->typePath).ptr,propertyId,
                     (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
  if (index == 0xffff) {
    this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
    bVar1 = DynamicObject::HasObjectArray(instance);
    BVar3 = 0;
    if (bVar1) {
      BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34);
      BVar3 = 0;
      if (BVar2 != 0) {
        BVar3 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,local_34[0]);
      }
    }
  }
  else {
    BVar3 = 1;
    if (info != (PropertyValueInfo *)0x0) {
      SetPropertyValueInfo
                (this,info,&instance->super_RecyclableObject,index,ObjectSlotAttr_Writable);
    }
  }
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerBase::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        uint32 indexVal;
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        PropertyIndex propertyIndex = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        if (propertyIndex != Constants::NoSlot)
        {
            if (info)
            {
                this->SetPropertyValueInfo(info, instance, propertyIndex);
            }
            return true;
        }

        // Check numeric propertyId only if objectArray is available
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return PathTypeHandlerBase::HasItem(instance, indexVal);
        }

        return false;
    }